

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O0

bool __thiscall miniply::PLYReader::which_property_type(PLYReader *this,PLYPropertyType *type)

{
  bool bVar1;
  uint local_24;
  uint32_t i;
  PLYPropertyType *type_local;
  PLYReader *this_local;
  
  local_24 = 0;
  while( true ) {
    if (*(long *)(kTypeAliases + (ulong)local_24 * 0x10) == 0) {
      return false;
    }
    bVar1 = keyword(this,*(char **)(kTypeAliases + (ulong)local_24 * 0x10));
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  *type = *(PLYPropertyType *)(kTypeAliases + (ulong)local_24 * 0x10 + 8);
  return true;
}

Assistant:

bool PLYReader::which_property_type(PLYPropertyType* type)
  {
    for (uint32_t i = 0; kTypeAliases[i].name != nullptr; i++) {
      if (keyword(kTypeAliases[i].name)) {
        *type = kTypeAliases[i].type;
        return true;
      }
    }
    return false;
  }